

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::StickyAdapter::makeSticky
          (StickyAdapter *this,RealType w0,RealType v0,RealType v0p,RealType rl,RealType ru,
          RealType rlp,RealType rup,bool isPower)

{
  bool bVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  shared_ptr<OpenMD::GenericData> *in_XMM6_Qa;
  StickyAtypeParameters stickyParam;
  string *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffff30;
  shared_ptr<OpenMD::GenericData> *this_00;
  StickyAtypeParameters *in_stack_ffffffffffffff50;
  element_type *in_stack_ffffffffffffff58;
  AtomType *this_01;
  
  bVar1 = isSticky((StickyAdapter *)0x2d40cc);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  this_01 = (AtomType *)(ulong)(in_SIL & 1);
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *)
        &stack0xffffffffffffff58;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,std::__cxx11::string_const&,OpenMD::StickyAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(this_01,in_XMM6_Qa);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2d41d2);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *)0x2d41dc);
  return;
}

Assistant:

void StickyAdapter::makeSticky(RealType w0, RealType v0, RealType v0p,
                                 RealType rl, RealType ru, RealType rlp,
                                 RealType rup, bool isPower) {
    if (isSticky()) { at_->removeProperty(StickyTypeID); }

    StickyAtypeParameters stickyParam {};
    stickyParam.w0      = w0;
    stickyParam.v0      = v0;
    stickyParam.v0p     = v0p;
    stickyParam.rl      = rl;
    stickyParam.ru      = ru;
    stickyParam.rlp     = rlp;
    stickyParam.rup     = rup;
    stickyParam.isPower = isPower;

    at_->addProperty(
        std::make_shared<StickyAtypeData>(StickyTypeID, stickyParam));
  }